

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::DumpAuxiliary
               (OpCode op,OpLayoutAuxiliary *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  VarArrayVarCount *pVVar4;
  PropertyIdArray *pPVar5;
  ScriptContext *this;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  AuxArray<double> *pAVar8;
  AuxArray<int> *pAVar9;
  AuxArray<void_*> *pAVar10;
  uint uVar11;
  ulong uVar12;
  undefined6 in_register_0000003a;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  iVar15 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar15) {
  case 0xcb:
    pVVar4 = ByteCodeReader::ReadVarArrayVarCount
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d ",(ulong)playout->R0);
    pvVar1 = pVVar4->count;
    if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_007fac80;
      *puVar7 = 0;
    }
    if (((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar3) goto LAB_007fac80;
      *puVar7 = 0;
    }
    uVar13 = 0;
    iVar15 = (int)pvVar1;
    Output::Print(L"= %d [",(ulong)pvVar1 & 0xffffffff);
    if (0 < iVar15) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar11 = 2;
      if (iVar15 - 1U < 2) {
        uVar11 = iVar15 - 1U;
      }
      uVar13 = 0;
      do {
        if (uVar13 != 0) {
          Output::Print(L", ");
        }
        uVar12 = (ulong)pVVar4[uVar13 + 1].count & 0xffff000000000000;
        if (((ulong)pVVar4[uVar13 + 1].count & 0x1ffff00000000) != 0x1000000000000 &&
            uVar12 == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_007fac80;
          *puVar7 = 0;
        }
        pvVar1 = pVVar4[uVar13 + 1].count;
        if (uVar12 == 0x1000000000000) {
          if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_007fac80;
            *puVar7 = 0;
          }
          if (((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x43,"(Is(aValue))",
                                        "Ensure var is actually a \'TaggedInt\'");
            if (!bVar3) goto LAB_007fac80;
            *puVar7 = 0;
          }
          Output::Print(L"%d",(ulong)pvVar1 & 0xffffffff);
        }
        else if ((ulong)pvVar1 >> 0x32 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x600,"(false)","false");
          if (!bVar3) goto LAB_007fac80;
          *puVar7 = 0;
        }
        else {
          Output::Print(L"%g",(ulong)pvVar1 ^ 0xfffc000000000000);
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 + 1 != uVar13);
    }
    if ((int)uVar13 == iVar15) goto LAB_007fac64;
    goto LAB_007fac56;
  case 0xce:
switchD_007fa628_caseD_ce:
    pPVar5 = ByteCodeReader::ReadPropertyIdArray
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    Output::Print(L" R%d ",(ulong)playout->R0);
    Output::Print(L"= %d [",(ulong)pPVar5->count);
    if (pPVar5->count != 0) {
      lVar14 = 2;
      uVar13 = 0;
      do {
        pPVar6 = ScriptContext::GetPropertyName(this,(&pPVar5->count)[lVar14]);
        if (lVar14 != 2) {
          Output::Print(L", ");
        }
        Output::Print(L"%s",pPVar6 + 1);
        if (1 < uVar13) break;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 1;
      } while (uVar13 < pPVar5->count);
      if (2 < pPVar5->count) {
        Output::Print(L", ...");
      }
    }
    Output::Print(L"], LiteralId %d",(ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1);
    return;
  case 0xd2:
    pAVar9 = ByteCodeReader::ReadAuxArray<int>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    uVar13 = 0;
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar9->count);
    uVar11 = pAVar9->count;
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        if (uVar12 != 0) {
          Output::Print(L", ");
        }
        Output::Print(L"%d",(ulong)pAVar9[uVar12 + 1].count);
        uVar13 = uVar12 + 1;
        uVar11 = pAVar9->count;
      } while ((uVar12 < 2) && (uVar12 = uVar13, uVar13 < uVar11));
    }
    break;
  case 0xd4:
    pAVar8 = ByteCodeReader::ReadAuxArray<double>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    uVar13 = 0;
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar8->count);
    uVar11 = pAVar8->count;
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        if (uVar12 != 0) {
          Output::Print(L", ");
        }
        Output::Print(L"%f",pAVar8[uVar12 + 1]);
        uVar13 = uVar12 + 1;
        uVar11 = pAVar8->count;
      } while ((uVar12 < 2) && (uVar12 = uVar13, uVar13 < uVar11));
    }
    break;
  default:
    if (iVar15 == 0xa3) {
      pAVar10 = ByteCodeReader::ReadAuxArray<void*>
                          ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
      uVar13 = 0;
      Output::Print(L" R%d ",(ulong)playout->R0);
      Output::Print(L"= %d [",(ulong)pAVar10->count);
      uVar11 = pAVar10->count;
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          if (uVar12 != 0) {
            Output::Print(L", ");
          }
          Output::Print(L"%d",pAVar10[uVar12 + 1]);
          uVar13 = uVar12 + 1;
          uVar11 = pAVar10->count;
        } while ((uVar12 < 2) && (uVar12 = uVar13, uVar13 < uVar11));
      }
      break;
    }
    if (iVar15 == 0xc1) goto switchD_007fa628_caseD_ce;
  case 0xcc:
  case 0xcd:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd3:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x60b,"(false)","Unknown OpCode for OpLayoutType::Auxiliary");
    if (bVar3) {
      *puVar7 = 0;
      return;
    }
LAB_007fac80:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if ((uint)uVar13 != uVar11) {
LAB_007fac56:
    Output::Print(L", ...");
  }
LAB_007fac64:
  Output::Print(L"]");
  return;
}

Assistant:

void
    ByteCodeDumper::DumpAuxiliary(OpCode op, const unaligned OpLayoutAuxiliary * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewScObjectLiteral:
            case OpCode::LdPropIds:
            {
                const Js::PropertyIdArray *propIds = reader.ReadPropertyIdArray(playout->Offset, dumpFunction);
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), propIds->count);
                for (uint i=0; i< propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                if (propIds->count >= 3)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("], LiteralId %d"), playout->C1);
                break;
            }
            case OpCode::StArrSegItem_A:
            {
                const Js::VarArray *vars = reader.ReadAuxArray<Var>(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), vars->count);
                uint i=0;
                for (; i<vars->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), vars->elements[i]);
                }
                if (i != vars->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScIntArray:
            {
                const Js::AuxArray<int32> *intArray = reader.ReadAuxArray<int32>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, intArray->count);
                uint i;
                for (i = 0; i<intArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), intArray->elements[i]);
                }
                if (i != intArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScFltArray:
            {
                const Js::AuxArray<double> *dblArray = reader.ReadAuxArray<double>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, dblArray->count);
                uint i;
                for (i = 0; i<dblArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%f"), dblArray->elements[i]);
                }
                if (i != dblArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScObject_A:
            {
                const Js::VarArrayVarCount *vars = reader.ReadVarArrayVarCount(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                int count = Js::TaggedInt::ToInt32(vars->count);
                Output::Print(_u("= %d ["), count);
                int i=0;
                for (; i<count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    if (TaggedInt::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%d"), TaggedInt::ToInt32(vars->elements[i]));
                    }
                    else if (JavascriptNumber::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%g"), JavascriptNumber::GetValue(vars->elements[i]));
                    }
                    else
                    {
                        Assert(false);
                    }
                }
                if (i != count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::Auxiliary");
                break;
        }
    }